

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::determineSubStruct
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
          *structure)

{
  pointer pMVar1;
  size_t __n;
  pointer pMVar2;
  pointer pMVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  TypeInfo *this_00;
  TypeInfo *rhs;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  anon_class_8_1_1e35b413 isSubStruct;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  local_e0;
  
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&((structure->second).members.
                       super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->name,"sType");
  if (iVar4 != 0) {
    p_Var6 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var5 = (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var6;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_true>
                (&local_e0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
                  *)(p_Var5 + 1));
      pMVar3 = local_e0.second.members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pMVar2 = local_e0.second.members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = (structure->second).members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_e0.second.members.
                        super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e0.second.members.
                       super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                       ._M_impl.super__Vector_impl_data._M_start) <
          (ulong)((long)(structure->second).members.
                        super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1)) {
        bVar7 = local_e0.second.members.
                super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_e0.second.members.
                super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (!bVar7) {
          bVar7 = TypeInfo::operator==
                            (&(local_e0.second.members.
                               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->type,&pMVar1->type);
          if (bVar7) {
            rhs = &pMVar1[1].type;
            this_00 = &pMVar2[1].type;
            do {
              __n = this_00[-4].postfix.field_2._M_allocated_capacity;
              if ((__n != rhs[-4].postfix.field_2._M_allocated_capacity) ||
                 ((__n != 0 &&
                  (iVar4 = bcmp((void *)this_00[-4].postfix._M_string_length,
                                (void *)rhs[-4].postfix._M_string_length,__n), iVar4 != 0)))) break;
              bVar7 = (pointer)&this_00[-1].postfix == pMVar3;
              if (bVar7) goto LAB_0013d5a7;
              bVar7 = TypeInfo::operator==(this_00,rhs);
              rhs = (TypeInfo *)((long)&rhs[4].prefix.field_2 + 8);
              this_00 = (TypeInfo *)((long)&this_00[4].prefix.field_2 + 8);
            } while (bVar7);
          }
          goto LAB_0013d5a4;
        }
      }
      else {
LAB_0013d5a4:
        bVar7 = false;
      }
LAB_0013d5a7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.second.subStruct._M_dataplus._M_p != &local_e0.second.subStruct.field_2) {
        operator_delete(local_e0.second.subStruct._M_dataplus._M_p,
                        local_e0.second.subStruct.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0.second.structExtends);
      std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>::
      ~vector(&local_e0.second.members);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&local_e0.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
        operator_delete(local_e0.first._M_dataplus._M_p,
                        local_e0.first.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) break;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::determineSubStruct( std::pair<std::string, StructureData> const & structure ) const
{
  if ( structure.second.members.front().name != "sType" )
  {
    // check if sd is a substruct of structure
    auto isSubStruct = [&structure]( std::pair<std::string, StructureData> const & sd ) noexcept
    {
      // member-by-member comparison of type and name
      auto memberIt = structure.second.members.begin();
      auto isMember = [&memberIt]( MemberData const & md ) noexcept
      {
        if ( ( md.type == memberIt->type ) && ( md.name == memberIt->name ) )
        {
          ++memberIt;
          return true;
        }
        return false;
      };

      return ( sd.second.members.size() < structure.second.members.size() ) && std::ranges::all_of( sd.second.members, isMember );
    };

    // look for a struct in m_structs that starts identically to structure
    auto structIt = std::ranges::find_if( m_structs, isSubStruct );
    return ( structIt == m_structs.end() ) ? "" : structIt->first;
  }
  return "";
}